

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::ShaderDepthRangeTest::iterate(ShaderDepthRangeTest *this)

{
  deUint32 err;
  qpTestResult qVar1;
  float extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  MessageBuilder local_1b8;
  DepthRangeParams local_38;
  DepthRangeParams cases [3];
  Functions *gl;
  ShaderDepthRangeTest *this_local;
  
  cases[2].zNear = (float)(*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  cases[2].zFar = extraout_var;
  anon_unknown_3::DepthRangeParams::DepthRangeParams(&local_38,0.0,1.0);
  anon_unknown_3::DepthRangeParams::DepthRangeParams(cases,1.5,-1.0);
  anon_unknown_3::DepthRangeParams::DepthRangeParams(cases + 1,0.7,0.3);
  this->m_depthRange = cases[(long)this->m_iterNdx + -1];
  this_00 = tcu::TestContext::getLog
                      ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [15])"glDepthRangef(");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->m_depthRange).zNear);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->m_depthRange).zFar);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x2a85ff4);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  (**(code **)((long)cases[2] + 0x4d8))((this->m_depthRange).zNear,(this->m_depthRange).zFar);
  err = (**(code **)((long)cases[2] + 0x800))();
  glu::checkError(err,"glDepthRangef()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x10c);
  deqp::gls::ShaderRenderCase::iterate(&this->super_ShaderRenderCase);
  this->m_iterNdx = this->m_iterNdx + 1;
  if ((this->m_iterNdx != 3) &&
     (qVar1 = tcu::TestContext::getTestResult
                        ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx),
     qVar1 == QP_TEST_RESULT_PASS)) {
    return CONTINUE;
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();

		const DepthRangeParams cases[] =
		{
			DepthRangeParams(0.0f,  1.0f),
			DepthRangeParams(1.5f, -1.0f),
			DepthRangeParams(0.7f,  0.3f)
		};

		m_depthRange = cases[m_iterNdx];
		m_testCtx.getLog() << tcu::TestLog::Message << "glDepthRangef(" << m_depthRange.zNear << ", " << m_depthRange.zFar << ")" << tcu::TestLog::EndMessage;
		gl.depthRangef(m_depthRange.zNear, m_depthRange.zFar);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDepthRangef()");

		gls::ShaderRenderCase::iterate();
		m_iterNdx += 1;

		if (m_iterNdx == DE_LENGTH_OF_ARRAY(cases) || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS)
			return STOP;
		else
			return CONTINUE;
	}